

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  uint uVar1;
  int iVar2;
  unsigned_short *puVar3;
  char *__function;
  float fVar4;
  
  uVar1 = (this->IndexLookup).Size;
  if ((int)uVar1 < 1) {
    __assert_fail("IndexLookup.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xcc4,"void ImFont::AddRemapChar(ImWchar, ImWchar, bool)");
  }
  if ((dst < uVar1) && ((this->IndexLookup).Data[dst] == 0xffff && !overwrite_dst)) {
    return;
  }
  if (uVar1 <= src && uVar1 <= dst) {
    return;
  }
  GrowIndex(this,dst + 1);
  iVar2 = (this->IndexLookup).Size;
  if (src < uVar1) {
    if (iVar2 <= (int)(uint)dst) {
LAB_00169514:
      __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
      goto LAB_00169540;
    }
    puVar3 = (this->IndexLookup).Data;
    puVar3[dst] = puVar3[src];
    fVar4 = (this->IndexAdvanceX).Data[src];
  }
  else {
    if (iVar2 <= (int)(uint)dst) goto LAB_00169514;
    (this->IndexLookup).Data[dst] = 0xffff;
    fVar4 = 1.0;
  }
  if ((int)(uint)dst < (this->IndexAdvanceX).Size) {
    (this->IndexAdvanceX).Data[dst] = fVar4;
    return;
  }
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_00169540:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,__function);
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}